

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O1

void __thiscall XPMP2::RmtDataAcAnimTy::add(RmtDataAcAnimTy *this,DR_VALS idx,float f)

{
  float fVar1;
  byte bVar2;
  ulong uVar3;
  XPMP2Error *this_00;
  float fVar4;
  float fVar5;
  
  bVar2 = (this->super_RmtDataBaseTy).field_0xd;
  uVar3 = (ulong)bVar2;
  if (uVar3 < 0x2a) {
    (&(this->super_RmtDataBaseTy).field_0xf)[uVar3 * 2] = idx;
    fVar4 = f - (float)(&REMOTE_DR_DEF)[(ulong)idx * 2];
    fVar1 = (float)(&DAT_002ef114)[(ulong)idx * 2];
    fVar5 = fVar1;
    if (fVar4 <= fVar1) {
      fVar5 = fVar4;
    }
    (&this->field_0x10)[uVar3 * 2] =
         (char)(int)((float)(~-(uint)(fVar4 < 0.0) & (uint)(fVar5 * 255.0)) / fVar1);
    (this->super_RmtDataBaseTy).field_0xd = bVar2 + 1;
    return;
  }
  this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
  XPMP2Error::XPMP2Error
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x1f1,"add","ASSERT FAILED: %s","data.numVals < V_COUNT");
  __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
}

Assistant:

void RmtDataAcAnimTy::add (DR_VALS idx, float f)
{
    LOG_ASSERT(data.numVals < V_COUNT);
    data.v[data.numVals].idx = idx;
    data.v[data.numVals].v   = REMOTE_DR_DEF[idx].pack(f);
    ++data.numVals;
}